

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

nodeclass * NodeClassResize(nodecontext *p,nodeclass *Old,size_t VMTSize)

{
  ulong uVar1;
  nodeclass *pnVar2;
  long *plVar3;
  nodeclass *pnVar4;
  
  pnVar2 = (nodeclass *)(*p->NodeHeap->ReAlloc)(p->NodeHeap,Old,Old->VMTSize + 0x48,VMTSize + 0x48);
  if (pnVar2 != (nodeclass *)0x0) {
    pnVar2->VMTSize = VMTSize;
    uVar1 = (p->NodeClass)._Used;
    if (7 < uVar1) {
      plVar3 = (long *)(p->NodeClass)._Begin;
      do {
        pnVar4 = (nodeclass *)*plVar3;
        if ((nodeclass *)*plVar3 == Old) {
          *plVar3 = (long)pnVar2;
          pnVar4 = pnVar2;
        }
        if (pnVar4->ParentClass == Old) {
          pnVar4->ParentClass = pnVar2;
        }
        plVar3 = plVar3 + 1;
      } while (plVar3 != (long *)((p->NodeClass)._Begin + (uVar1 & 0xfffffffffffffff8)));
    }
  }
  return pnVar2;
}

Assistant:

static nodeclass* NodeClassResize(nodecontext* p,nodeclass* Old,size_t VMTSize)
{
    nodeclass* New = MemHeap_ReAlloc(p->NodeHeap,Old,sizeof(nodeclass)+Old->VMTSize,sizeof(nodeclass)+VMTSize);
    if (New)
    {
        nodeclass** i;

        New->VMTSize = VMTSize;

        for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        {
            if (*i == Old)
                *i = New;
            if ((*i)->ParentClass == Old)
                (*i)->ParentClass = New;
        }
    }
    return New;
}